

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_fprintdot_rec(FILE *out,MTBDD mtbdd)

{
  int iVar1;
  uint32_t uVar2;
  mtbddnode_t n_00;
  MTBDD MVar3;
  uint64_t uVar4;
  MTBDD MVar5;
  char *pcVar6;
  mtbddnode_t n;
  MTBDD mtbdd_local;
  FILE *out_local;
  
  n_00 = MTBDD_GETNODE(mtbdd);
  iVar1 = mtbddnode_getmark(n_00);
  if (iVar1 == 0) {
    mtbddnode_setmark(n_00,1);
    if ((mtbdd == 0x8000000000000000) || (mtbdd == 0)) {
      fprintf((FILE *)out,"0 [shape=box, style=filled, label=\"F\"];\n");
    }
    else {
      iVar1 = mtbddnode_isleaf(n_00);
      if (iVar1 == 0) {
        MVar3 = MTBDD_STRIPMARK(mtbdd);
        uVar2 = mtbddnode_getvariable(n_00);
        fprintf((FILE *)out,"%lu [label=\"%u\"];\n",MVar3,(ulong)uVar2);
        uVar4 = mtbddnode_getlow(n_00);
        mtbdd_fprintdot_rec(out,uVar4);
        uVar4 = mtbddnode_gethigh(n_00);
        mtbdd_fprintdot_rec(out,uVar4);
        MVar3 = MTBDD_STRIPMARK(mtbdd);
        uVar4 = mtbddnode_getlow(n_00);
        fprintf((FILE *)out,"%lu -> %lu [style=dashed];\n",MVar3,uVar4);
        MVar3 = MTBDD_STRIPMARK(mtbdd);
        uVar4 = mtbddnode_gethigh(n_00);
        MVar5 = MTBDD_STRIPMARK(uVar4);
        iVar1 = mtbddnode_getcomp(n_00);
        pcVar6 = "none";
        if (iVar1 != 0) {
          pcVar6 = "dot";
        }
        fprintf((FILE *)out,"%lu -> %lu [style=solid dir=both arrowtail=%s];\n",MVar3,MVar5,pcVar6);
      }
      else {
        MVar3 = MTBDD_STRIPMARK(mtbdd);
        fprintf((FILE *)out,"%lu [shape=box, style=filled, label=\"",MVar3);
        mtbdd_fprint_leaf(out,mtbdd);
        fprintf((FILE *)out,"\"];\n");
      }
    }
  }
  return;
}

Assistant:

static void
mtbdd_fprintdot_rec(FILE *out, MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd); // also works for mtbdd_false
    if (mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 1);

    if (mtbdd == mtbdd_true || mtbdd == mtbdd_false) {
        fprintf(out, "0 [shape=box, style=filled, label=\"F\"];\n");
    } else if (mtbddnode_isleaf(n)) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"", MTBDD_STRIPMARK(mtbdd));
        mtbdd_fprint_leaf(out, mtbdd);
        fprintf(out, "\"];\n");
    } else {
        fprintf(out, "%" PRIu64 " [label=\"%" PRIu32 "\"];\n",
                MTBDD_STRIPMARK(mtbdd), mtbddnode_getvariable(n));

        mtbdd_fprintdot_rec(out, mtbddnode_getlow(n));
        mtbdd_fprintdot_rec(out, mtbddnode_gethigh(n));

        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=dashed];\n",
                MTBDD_STRIPMARK(mtbdd), mtbddnode_getlow(n));
        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=solid dir=both arrowtail=%s];\n",
                MTBDD_STRIPMARK(mtbdd), MTBDD_STRIPMARK(mtbddnode_gethigh(n)),
                mtbddnode_getcomp(n) ? "dot" : "none");
    }
}